

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void envy_bios_print_mem_type(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_mem_type *peVar1;
  char *local_40;
  uint local_34;
  uint local_30;
  int i;
  uint8_t ram_cfg;
  envy_bios_mem_type *mt;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->mem).type;
  if (strap == 0) {
    local_34 = 0xff;
  }
  else {
    local_34 = (strap & 0x1c) >> 2;
  }
  if ((peVar1->offset != 0) && ((mask & 0x1000) != 0)) {
    fprintf((FILE *)out,"MEM TYPE table at 0x%x, version %x, %u entries\n",(ulong)peVar1->offset,
            (ulong)(bios->mem).type.version,(ulong)(bios->mem).type.entriesnum);
    if ((bios->mem).type.version == '\x10') {
      if (strap == 0) {
        local_40 = "Missing strap_peek!";
      }
      else {
        local_40 = mem_type((bios->mem).type.version,
                            peVar1->offset + (ushort)(bios->mem).type.hlen +
                            (ushort)(byte)local_34 * (ushort)(bios->mem).type.rlen);
      }
      printf("Detected ram type: %s\n",local_40);
    }
    envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->mem).type.hlen,mask);
    if ((mask & 0x80000000) != 0) {
      fprintf((FILE *)out,"\n");
    }
    for (local_30 = 0; (int)local_30 < (int)(uint)(bios->mem).type.entriesnum;
        local_30 = local_30 + 1) {
      if (local_30 == local_34) {
        fprintf((FILE *)out,"   *");
      }
      else {
        fprintf((FILE *)out,"    ");
      }
      fprintf((FILE *)out,"%02u: Ram type: %s\n",(ulong)local_30,
              (bios->mem).type.entries[(int)local_30]);
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset + (uint)(bios->mem).type.hlen +
                                  (bios->mem).type.rlen * local_30,(uint)(bios->mem).type.rlen,mask)
      ;
    }
    fprintf((FILE *)out,"\n");
  }
  return;
}

Assistant:

void
envy_bios_print_mem_type(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem_type *mt = &bios->mem.type;
	uint8_t ram_cfg = strap?(strap & 0x1c) >> 2:0xff;
	int i;

	if (!mt->offset || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "MEM TYPE table at 0x%x, version %x, %u entries\n", mt->offset, mt->version, mt->entriesnum);
	if(mt->version == 0x10) {
		printf("Detected ram type: %s\n",
		       strap ? mem_type(mt->version, mt->offset + mt->hlen + (ram_cfg*mt->rlen)) : "Missing strap_peek!");
	}

	envy_bios_dump_hex(bios, out, mt->offset, mt->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < mt->entriesnum; i++) {
		if(i == ram_cfg) {
			fprintf(out, "   *");
		} else {
			fprintf(out,"    ");
		}
		fprintf(out,"%02u: Ram type: %s\n", i, mt->entries[i]);
		envy_bios_dump_hex(bios, out, mt->offset + mt->hlen + (mt->rlen * i), mt->rlen, mask);
	}

	fprintf(out, "\n");
}